

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

CPpmd_See * Ppmd8_MakeEscFreq(CPpmd8 *p,uint numMasked1,UInt32 *escFreq)

{
  int iVar1;
  CPpmd_See *pCStack_28;
  uint r;
  CPpmd_See *see;
  UInt32 *escFreq_local;
  uint numMasked1_local;
  CPpmd8 *p_local;
  
  if (p->MinContext->NumStats == 0xff) {
    pCStack_28 = &p->DummySee;
    *escFreq = 1;
  }
  else {
    pCStack_28 = p->See[p->NS2Indx[p->MinContext->NumStats + 2] - 3] +
                 (long)(int)(uint)((ushort)((p->MinContext->NumStats + 1) * 0xb) <
                                  p->MinContext->SummFreq) +
                 (ulong)((uint)p->MinContext->NumStats << 1 <
                        p->Base[p->MinContext->Suffix] + numMasked1) * 2 +
                 (long)(int)(uint)p->MinContext->Flags;
    iVar1 = (int)(uint)pCStack_28->Summ >> (pCStack_28->Shift & 0x1f);
    pCStack_28->Summ = pCStack_28->Summ - (short)iVar1;
    *escFreq = iVar1 + (uint)(iVar1 == 0);
  }
  return pCStack_28;
}

Assistant:

CPpmd_See *Ppmd8_MakeEscFreq(CPpmd8 *p, unsigned numMasked1, UInt32 *escFreq)
{
  CPpmd_See *see;
  if (p->MinContext->NumStats != 0xFF)
  {
    see = p->See[(unsigned)p->NS2Indx[(unsigned)p->MinContext->NumStats + 2] - 3] +
        (p->MinContext->SummFreq > 11 * ((unsigned)p->MinContext->NumStats + 1)) +
        2 * (unsigned)(2 * (unsigned)p->MinContext->NumStats <
        ((unsigned)SUFFIX(p->MinContext)->NumStats + numMasked1)) +
        p->MinContext->Flags;
    {
      unsigned r = (see->Summ >> see->Shift);
      see->Summ = (UInt16)(see->Summ - r);
      *escFreq = r + (r == 0);
    }
  }
  else
  {
    see = &p->DummySee;
    *escFreq = 1;
  }
  return see;
}